

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O2

void __thiscall
Database::MaxHeap::insert
          (MaxHeap *this,uint32_t orderkey,uint16_t orderdate,uint32_t extendedpricesum)

{
  uint *puVar1;
  
  puVar1 = this->c3Result;
  if (*puVar1 < extendedpricesum) {
    *this->c1Result = orderkey;
    *this->c2Result = orderdate;
    *puVar1 = extendedpricesum;
    adjust(this,(uint)this->size);
    return;
  }
  return;
}

Assistant:

inline void insert(uint32_t orderkey, uint16_t orderdate, uint32_t extendedpricesum) {
      if (extendedpricesum <= c3Result[0]) {
        return;
      }

      c1Result[0] = orderkey;
      c2Result[0] = orderdate;
      c3Result[0] = extendedpricesum;
      adjust(size);
    }